

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall
soul::HTMLGenerator::printAnnotation(HTMLGenerator *this,HTMLElement *parent,Annotation *a)

{
  Annotation *this_00;
  bool bVar1;
  bool bVar2;
  HTMLElement *pHVar3;
  string_view text;
  string_view local_d8;
  string_view local_c8;
  HTMLElement *local_b8;
  HTMLElement *value;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  reference local_70;
  value_type *prop;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
  *__range3;
  undefined1 auStack_48 [7];
  bool first;
  string_view local_38;
  HTMLElement *local_28;
  HTMLElement *div;
  Annotation *a_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  div = (HTMLElement *)a;
  a_local = (Annotation *)parent;
  parent_local = (HTMLElement *)this;
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
          ::empty(&a->properties);
  this_00 = a_local;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"annotation")
    ;
    pHVar3 = choc::html::HTMLElement::addDiv((HTMLElement *)this_00,local_38);
    local_28 = pHVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,"[[ ");
    choc::html::HTMLElement::addContent(pHVar3,_auStack_48);
    pHVar3 = div;
    bVar1 = true;
    __end3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
                      *)div);
    prop = (value_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>_>
                  *)pHVar3);
    while( true ) {
      bVar2 = std::__detail::operator!=
                        (&__end3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_true>
                           *)&prop);
      pHVar3 = local_28;
      if (!bVar2) break;
      local_70 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_false,_true>
                 ::operator*(&__end3);
      pHVar3 = local_28;
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,", ");
        choc::html::HTMLElement::addContent(pHVar3,local_80);
      }
      pHVar3 = local_28;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_90,"annotation_name");
      pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_90);
      text = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
      local_a0 = text;
      choc::html::HTMLElement::addContent(pHVar3,text);
      pHVar3 = local_28;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&value,": ");
      choc::html::HTMLElement::addContent(pHVar3,_value);
      pHVar3 = local_28;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,"annotation_value");
      pHVar3 = choc::html::HTMLElement::addSpan(pHVar3,local_c8);
      local_b8 = choc::html::HTMLElement::setInline(pHVar3,true);
      printExpression(this,local_b8,&local_70->second);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_false,_true>
      ::operator++(&__end3);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8," ]]");
    choc::html::HTMLElement::addContent(pHVar3,local_d8);
  }
  return;
}

Assistant:

void printAnnotation (choc::html::HTMLElement& parent, const SourceCodeModel::Annotation& a)
    {
        if (! a.properties.empty())
        {
            auto& div = parent.addDiv ("annotation");
            div.addContent ("[[ ");
            bool first = true;

            for (auto& prop : a.properties)
            {
                if (first)
                    first = false;
                else
                    div.addContent (", ");

                div.addSpan ("annotation_name").addContent (prop.first);
                div.addContent (": ");
                auto& value = div.addSpan ("annotation_value").setInline (true);
                printExpression (value, prop.second);
            }

            div.addContent (" ]]");
        }
    }